

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_subd.cpp
# Opt level: O0

ON_SHA1_Hash * __thiscall
ON_SubDimple::EdgeHash
          (ON_SHA1_Hash *__return_storage_ptr__,ON_SubDimple *this,ON_SubDHashType hash_type)

{
  ON_SubDEdge *first_edge;
  ON_SubDHashType hash_type_00;
  uint level_index;
  ON_SubDLevel *pOVar1;
  undefined1 local_40 [8];
  ON_SubDEdgeIdIterator eidit;
  ON_SubDHashType hash_type_local;
  ON_SubDimple *this_local;
  
  eidit.m_subd_ref.m_subd_sp.super___shared_ptr<ON_SubD,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
  _M_pi._7_1_ = hash_type;
  ON_SubDEdgeIdIterator::ON_SubDEdgeIdIterator((ON_SubDEdgeIdIterator *)local_40);
  InitializeEdgeIdIterator(this,(ON_SubDEdgeIdIterator *)local_40);
  hash_type_00 = eidit.m_subd_ref.m_subd_sp.super___shared_ptr<ON_SubD,_(__gnu_cxx::_Lock_policy)2>.
                 _M_refcount._M_pi._7_1_;
  pOVar1 = ActiveLevel(this);
  first_edge = pOVar1->m_edge[0];
  level_index = ActiveLevelIndex(this);
  Internal_EdgeHash(__return_storage_ptr__,hash_type_00,first_edge,level_index,
                    (ON_SubDEdgeIdIterator *)local_40);
  ON_SubDEdgeIdIterator::~ON_SubDEdgeIdIterator((ON_SubDEdgeIdIterator *)local_40);
  return __return_storage_ptr__;
}

Assistant:

const ON_SHA1_Hash ON_SubDimple::EdgeHash(ON_SubDHashType hash_type) const
{
  ON_SubDEdgeIdIterator eidit;
  this->InitializeEdgeIdIterator(eidit);
  return Internal_EdgeHash(hash_type, ActiveLevel().m_edge[0], this->ActiveLevelIndex(), eidit);
}